

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void extend_dill_stream(dill_stream_conflict s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *__src;
  int iVar3;
  int iVar4;
  void *__dest;
  long in_RDI;
  void *new;
  void *old;
  int new_size;
  int cur_ip;
  int size;
  
  iVar3 = ((int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x10) - (int)**(undefined8 **)(in_RDI + 8))
          + 0x3c;
  uVar1 = *(undefined8 *)(*(long *)(in_RDI + 8) + 8);
  uVar2 = **(undefined8 **)(in_RDI + 8);
  __src = (void *)**(undefined8 **)(in_RDI + 8);
  __dest = mmap((void *)0x0,(long)(iVar3 * 2),7,0x22,-1,0);
  if (__dest == (void *)0xffffffffffffffff) {
    perror("mmap1");
  }
  memcpy(__dest,__src,(long)iVar3);
  **(undefined8 **)(in_RDI + 8) = __dest;
  iVar4 = munmap(__src,(long)iVar3);
  if (iVar4 == -1) {
    perror("munmap exp");
  }
  *(long *)(*(long *)(in_RDI + 8) + 8) = **(long **)(in_RDI + 8) + (long)((int)uVar1 - (int)uVar2);
  *(long *)(*(long *)(in_RDI + 8) + 0x10) = **(long **)(in_RDI + 8) + (long)(iVar3 * 2) + -0x3c;
  return;
}

Assistant:

extern void
extend_dill_stream(dill_stream s)
{
    int size = (int)((char*)s->p->code_limit - (char*)s->p->code_base +
                     END_OF_CODE_BUFFER);
    int cur_ip = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);
    int new_size = size * 2;
#ifdef USE_MMAP_CODE_SEG
    {
        void* old = s->p->code_base;
        void* new = mmap(0, new_size, PROT_EXEC | PROT_READ | PROT_WRITE,
                         MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
        if (new == (void*)-1)
            perror("mmap1");
        memcpy(new, old, size);
        s->p->code_base = new;
        if (munmap(old, size) == -1)
            perror("munmap exp");
    }
#else
    s->p->code_base = realloc(s->p->code_base, new_size);
#endif
    s->p->cur_ip = ((char*)s->p->code_base) + cur_ip;
    s->p->code_limit = ((char*)s->p->code_base) + new_size - END_OF_CODE_BUFFER;
}